

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O2

Token * __thiscall
ComplexType::parseNumber
          (Token *__return_storage_ptr__,ComplexType *this,string *str,char *current,size_t *index)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  int iVar3;
  ulong uVar4;
  NumericConstant *this_01;
  bool bVar5;
  initializer_list<NumericConstantChar> __l;
  NumericConstantChar local_92;
  allocator_type local_91;
  Token *local_90;
  NumericChars chars;
  NumericConstant local_70;
  NumericConstant local_50;
  
  local_90 = __return_storage_ptr__;
  if (*current == 'i') {
    chars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
    super__Vector_impl_data._M_start = &local_92;
    local_92 = ImaginaryUnit;
    chars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x1;
    NumericConstant::NumericConstant(&local_50,(initializer_list<NumericConstantChar> *)&chars);
    Token::Token(__return_storage_ptr__,&local_50);
    this_01 = &local_50;
  }
  else {
    local_92 = NumericConstantChars::getChar(*current);
    __l._M_len = 1;
    __l._M_array = &local_92;
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
              (&chars,__l,&local_91);
    uVar4 = *index;
    bVar5 = false;
    while (uVar4 = uVar4 + 1, uVar4 < str->_M_string_length) {
      iVar2 = tolower((int)(str->_M_dataplus)._M_p[uVar4]);
      *current = (char)iVar2;
      iVar3 = iVar2 << 0x18;
      if (iVar3 == 0x2e000000) {
        bVar1 = true;
        if (bVar5) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"The token already contains a decimal point.");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        if (iVar3 == 0x69000000) {
          *index = uVar4;
          local_92 = ImaginaryUnit;
          std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
          emplace_back<NumericConstantChar>(&chars,&local_92);
          break;
        }
        bVar1 = bVar5;
        if (9 < (iVar3 >> 0x18) - 0x30U) break;
      }
      bVar5 = bVar1;
      local_92 = NumericConstantChars::getChar((char)iVar2);
      std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
      emplace_back<NumericConstantChar>(&chars,&local_92);
      *index = uVar4;
    }
    NumericConstant::NumericConstant(&local_70,&chars);
    Token::Token(local_90,&local_70);
    std::_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~_Vector_base
              ((_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)&local_70)
    ;
    this_01 = (NumericConstant *)&chars;
  }
  std::_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~_Vector_base
            ((_Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)this_01);
  return local_90;
}

Assistant:

Token ComplexType::parseNumber(std::string& str, char& current, std::size_t& index) const {
	if (current == 'i') {
		return NumericConstant({ NumericConstantChar::ImaginaryUnit });
	}

	NumericChars chars({ NumericConstantChars::getChar(current) });
	bool hasDecimalPoint = false;

	while (true) {
		std::size_t next = index + 1;

		if (next >= str.size()) {
			break;
		}

		current = (char)std::tolower(str[next]);

		if (current == '.') {
			if (!hasDecimalPoint) {
				hasDecimalPoint = true;
			} else {
				throw std::runtime_error("The token already contains a decimal point.");
			}
		} else if (current == 'i') {
			index = next;
			chars.push_back(NumericConstantChar::ImaginaryUnit);
			break;
		} else {
			if (!isdigit(current)) {
				break;
			}
		}

		chars.push_back(NumericConstantChars::getChar(current));
		index = next;
	}

	return NumericConstant(chars);
}